

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall OneWireSimulationDataGenerator::SimResetPacket(OneWireSimulationDataGenerator *this)

{
  uint uVar1;
  
  uVar1 = (int)this + 0x18;
  SimulationChannelDescriptor::GetCurrentSampleNumber();
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::Advance(uVar1);
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::Advance(uVar1);
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::Advance(uVar1);
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::Advance(uVar1);
  return;
}

Assistant:

void OneWireSimulationDataGenerator::SimResetPacket()
{
    U32 reset_window_length = 960;
    U32 reset_pulse_length = 480;
    if( ( ( mOneWireSimulationData.GetCurrentSampleNumber() >> 5 ) % 20 ) > 15 )
        reset_pulse_length = 440;
    U32 device_responce_delay = 30;
    U32 device_responce_length = 120;

    if( mSimOverdrive == true )
    {
        reset_window_length = 96;
        reset_pulse_length = 48;
        device_responce_delay = 4;
        device_responce_length = 12;
    }

    // mOneWireTransitions->push_back(mSimulationSampleIndex);
    mOneWireSimulationData.Transition();
    // mSimulationSampleIndex += UsToSamples(reset_pulse_length );		//Reset Pulse Length
    mOneWireSimulationData.Advance( U32( UsToSamples( reset_pulse_length ) ) );
    // mOneWireTransitions->push_back(mSimulationSampleIndex);
    mOneWireSimulationData.Transition();
    // mSimulationSampleIndex += UsToSamples(device_responce_delay );		//Typical delay before responce
    mOneWireSimulationData.Advance( U32( UsToSamples( device_responce_delay ) ) );
    // mOneWireTransitions->push_back(mSimulationSampleIndex);
    mOneWireSimulationData.Transition();
    // mSimulationSampleIndex += UsToSamples(device_responce_length );		//Typical responce length
    mOneWireSimulationData.Advance( U32( UsToSamples( device_responce_length ) ) );
    // mOneWireTransitions->push_back(mSimulationSampleIndex);
    mOneWireSimulationData.Transition();
    // mSimulationSampleIndex += UsToSamples( reset_window_length - reset_pulse_length - device_responce_delay - device_responce_length,
    // true );	//Required Time for Reset and Presence opperation.
    mOneWireSimulationData.Advance(
        U32( UsToSamples( reset_window_length - reset_pulse_length - device_responce_delay - device_responce_length ) ) );
}